

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::TermPass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,MatchCharNode *deferredCharNode,
          bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  code *pcVar2;
  CharSet<char16_t> *pCVar3;
  CharSet<char16_t> *pCVar4;
  CountDomain CVar5;
  CountDomain CVar6;
  CountDomain CVar7;
  uint16 uVar8;
  undefined4 uVar9;
  bool bVar10;
  EncodedChar EVar11;
  CharCount lower;
  CharCountOrFlag upper;
  undefined4 *puVar12;
  Char *pCVar13;
  MatchCharNode *pMVar14;
  EncodedChar *pEVar15;
  Node *pNVar16;
  Char CVar17;
  char *message;
  Char *pCVar18;
  EncodedChar *pEVar19;
  uint uVar20;
  int iVar21;
  MatchCharNode *local_38;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  local_38 = (MatchCharNode *)0x0;
  pCVar13 = this->next;
  if (this->inputLim < pCVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar10) goto LAB_00ea9166;
    *puVar12 = 0;
    pCVar13 = this->next;
  }
  CVar17 = *pCVar13;
  if (0x3e < (ushort)CVar17) {
    switch(CVar17) {
    case L'[':
      if (this->inputLim < pCVar13 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pCVar13 = this->next;
      }
      this->next = pCVar13 + 1;
      if (((this->unicodeFlagPresent == true) &&
          (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0)) &&
         (this->currentSurrogatePairNode->rangeLocation == pCVar13 + 1)) {
        local_38 = (MatchCharNode *)CharacterClassPass1<true>(this);
      }
      else {
        local_38 = (MatchCharNode *)CharacterClassPass1<false>(this);
      }
      pEVar15 = this->next;
      if (this->inputLim < pEVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      if (*pEVar15 != L']') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x580,"(ECLookahead() == \']\')","ECLookahead() == \']\'");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      if (this->inputLim < pEVar15 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      this->next = pEVar15 + 1;
      break;
    case L'\\':
      if (this->inputLim < pCVar13 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pCVar13 = this->next;
      }
      this->next = pCVar13 + 1;
      bVar10 = SurrogatePairPass1(this,(Node **)&local_38,deferredCharNode,previousSurrogatePart);
      if ((!bVar10) &&
         (bVar10 = AtomEscapePass1(this,(Node **)&local_38,deferredCharNode,previousSurrogatePart),
         bVar10)) {
        return &local_38->super_Node;
      }
      break;
    case L']':
      CVar17 = L']';
      if (this->inputLim <= pCVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x25d,"(!IsEOF())","!IsEOF()");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pCVar13 = this->next;
        CVar17 = *pCVar13;
      }
      this->next = pCVar13 + 1;
      deferredCharNode->cs[0] = CVar17;
      local_38 = deferredCharNode;
      goto LAB_00ea8956;
    case L'^':
      if (this->inputLim < pCVar13 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pCVar13 = this->next;
      }
      this->next = pCVar13 + 1;
      pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x364470);
      pNVar16->tag = BOL;
      pNVar16->features = 0;
      goto LAB_00ea84b6;
    default:
      if (CVar17 == L'?') goto switchD_00ea7cc5_caseD_2a;
      if (CVar17 == L'|') goto switchD_00ea7cc5_caseD_29;
      goto switchD_00ea7cc5_caseD_25;
    }
    goto LAB_00ea7fdd;
  }
  switch(CVar17) {
  case L'$':
    if (this->inputLim < pCVar13 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pCVar13 = this->next;
    }
    this->next = pCVar13 + 1;
    pNVar16 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x364470);
    pNVar16->tag = EOL;
    pNVar16->features = 0;
LAB_00ea84b6:
    *(uint *)&pNVar16->field_0xc = *(uint *)&pNVar16->field_0xc & 0xffff8000;
    pNVar16->firstSet = (CharSet<char16_t> *)0x0;
    pNVar16->followSet = (CharSet<char16_t> *)0x0;
    (pNVar16->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar16->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar16->thisConsumes).upper = 0xffffffff;
    (pNVar16->followConsumes).upper = 0xffffffff;
    pNVar16->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542770;
    return pNVar16;
  case L'%':
  case L'&':
  case L'\'':
  case L',':
  case L'-':
    goto switchD_00ea7cc5_caseD_25;
  case L'(':
    pCVar18 = this->inputLim;
    if (pCVar18 < pCVar13 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pCVar18 = this->inputLim;
      pCVar13 = this->next;
    }
    pCVar13 = pCVar13 + 1;
    this->next = pCVar13;
    if (pCVar18 < pCVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pCVar13 = this->next;
    }
    if (*pCVar13 == L'?') {
      if (this->inputLim < pCVar13 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pCVar13 = this->next;
      }
      CVar17 = pCVar13[1];
      if (CVar17 == L'!') {
        ECConsume(this,2);
        pNVar16 = DisjunctionPass1(this);
        EVar11 = ECLookahead(this,0);
        if (EVar11 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x54f,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar10) goto LAB_00ea9166;
          *puVar12 = 0;
        }
        ECConsume(this,1);
        local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
        (local_38->super_Node).tag = Assertion;
        (local_38->super_Node).features = 0;
        puVar1 = &(local_38->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (local_38->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (local_38->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (local_38->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(local_38->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(local_38->super_Node).thisConsumes.upper = 0xffffffff;
        (local_38->super_Node).followConsumes.upper = 0xffffffff;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01543030;
        *(Node **)local_38->cs = pNVar16;
        local_38->isEquivClass = true;
      }
      else {
        if (CVar17 == L':') {
          ECConsume(this,2);
          local_38 = (MatchCharNode *)DisjunctionPass1(this);
          EVar11 = ECLookahead(this,0);
          if (EVar11 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x556,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
            if (!bVar10) goto LAB_00ea9166;
            *puVar12 = 0;
          }
          ECConsume(this,1);
          goto LAB_00ea7fdd;
        }
        if (CVar17 != L'=') {
          iVar21 = this->nextGroupId;
          this->nextGroupId = iVar21 + 1;
          pMVar14 = (MatchCharNode *)DisjunctionPass1(this);
          EVar11 = ECLookahead(this,0);
          if (EVar11 != L')') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x55e,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
            if (!bVar10) goto LAB_00ea9166;
            *puVar12 = 0;
          }
          ECConsume(this,1);
          goto LAB_00ea88ec;
        }
        ECConsume(this,2);
        pNVar16 = DisjunctionPass1(this);
        EVar11 = ECLookahead(this,0);
        if (EVar11 != L')') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                              ,0x548,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
          if (!bVar10) goto LAB_00ea9166;
          *puVar12 = 0;
        }
        ECConsume(this,1);
        local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
        (local_38->super_Node).tag = Assertion;
        (local_38->super_Node).features = 0;
        puVar1 = &(local_38->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (local_38->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (local_38->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (local_38->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(local_38->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(local_38->super_Node).thisConsumes.upper = 0xffffffff;
        (local_38->super_Node).followConsumes.upper = 0xffffffff;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01543030;
        *(Node **)local_38->cs = pNVar16;
        local_38->isEquivClass = false;
      }
      *(undefined4 *)&local_38->field_0x44 = 0;
    }
    else {
      iVar21 = this->nextGroupId;
      this->nextGroupId = iVar21 + 1;
      pMVar14 = (MatchCharNode *)DisjunctionPass1(this);
      pEVar15 = this->next;
      local_38 = pMVar14;
      if (this->inputLim < pEVar15) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      if (*pEVar15 != L')') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x56a,"(ECLookahead() == \')\')","ECLookahead() == \')\'");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      if (this->inputLim < pEVar15 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      this->next = pEVar15 + 1;
LAB_00ea88ec:
      local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x50,this->ctAllocator,0x364470);
      (local_38->super_Node).tag = DefineGroup;
      (local_38->super_Node).features = 0;
      puVar1 = &(local_38->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (local_38->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (local_38->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (local_38->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(local_38->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(local_38->super_Node).thisConsumes.upper = 0xffffffff;
      (local_38->super_Node).followConsumes.upper = 0xffffffff;
      (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542d90;
      *(MatchCharNode **)local_38->cs = pMVar14;
      *(int *)&local_38->isEquivClass = iVar21;
      *(undefined4 *)&local_38->field_0x44 = 2;
      *(undefined1 *)&local_38[1].super_Node._vptr_Node = 0;
    }
    goto LAB_00ea8956;
  case L')':
switchD_00ea7cc5_caseD_29:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    message = "false";
    uVar20 = 0x586;
    goto LAB_00ea7fc5;
  case L'*':
  case L'+':
switchD_00ea7cc5_caseD_2a:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    message = "Allowed only in the escaped form. These should be caught by TermPass0.";
    uVar20 = 0x592;
LAB_00ea7fc5:
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,uVar20,"(false)",message);
    if (!bVar10) goto LAB_00ea9166;
    *puVar12 = 0;
    goto LAB_00ea7fdd;
  case L'.':
    if (this->inputLim < pCVar13 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pCVar13 = this->next;
    }
    this->next = pCVar13 + 1;
    local_38 = (MatchCharNode *)GetNodeWithValidCharacterSet(this,L'.');
    goto LAB_00ea7fdd;
  }
  if ((CVar17 == L'\0') && (this->inputLim <= pCVar13)) {
    Fail(this,-0x7ff5ec67);
  }
switchD_00ea7cc5_caseD_25:
  bVar10 = SurrogatePairPass1(this,(Node **)&local_38,deferredCharNode,previousSurrogatePart);
  if (bVar10) {
LAB_00ea7fdd:
    if (local_38 == (MatchCharNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0x5a7,"(node != 0)","node != 0");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
    }
  }
  else {
    pCVar13 = this->next;
    if (this->inputLim <= pCVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pCVar13 = this->next;
    }
    this->next = pCVar13 + 1;
    deferredCharNode->cs[0] = *pCVar13;
    local_38 = deferredCharNode;
  }
LAB_00ea8956:
  bVar10 = AtQuantifier(this);
  if (!bVar10) {
    return &local_38->super_Node;
  }
  pEVar15 = this->next;
  if (this->inputLim < pEVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar10) goto LAB_00ea9166;
    *puVar12 = 0;
    pEVar15 = this->next;
  }
  EVar11 = *pEVar15;
  if ((ushort)EVar11 < 0x3f) {
    if (EVar11 == L'*') {
      if (local_38 == deferredCharNode) {
        local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_015426a8;
        uVar8 = (deferredCharNode->super_Node).features;
        uVar9 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar3 = (deferredCharNode->super_Node).firstSet;
        pCVar4 = (deferredCharNode->super_Node).followSet;
        CVar5 = (deferredCharNode->super_Node).prevConsumes;
        CVar6 = (deferredCharNode->super_Node).thisConsumes;
        CVar7 = (deferredCharNode->super_Node).followConsumes;
        (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_38->super_Node).features = uVar8;
        *(undefined4 *)&(local_38->super_Node).field_0xc = uVar9;
        (local_38->super_Node).firstSet = pCVar3;
        (local_38->super_Node).followSet = pCVar4;
        (local_38->super_Node).prevConsumes = CVar5;
        (local_38->super_Node).thisConsumes = CVar6;
        (local_38->super_Node).followConsumes = CVar7;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
        *(undefined8 *)local_38->cs = *(undefined8 *)deferredCharNode->cs;
        local_38->isEquivClass = deferredCharNode->isEquivClass;
        pEVar15 = this->next;
      }
      if (this->inputLim < pEVar15 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      this->next = pEVar15 + 1;
      bVar10 = OptNonGreedy(this);
      lower = 0;
    }
    else {
      if (EVar11 != L'+') {
LAB_00ea8d45:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        uVar20 = 0x5dd;
        goto LAB_00ea903c;
      }
      if (local_38 == deferredCharNode) {
        local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_015426a8;
        uVar8 = (deferredCharNode->super_Node).features;
        uVar9 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
        pCVar3 = (deferredCharNode->super_Node).firstSet;
        pCVar4 = (deferredCharNode->super_Node).followSet;
        CVar5 = (deferredCharNode->super_Node).prevConsumes;
        CVar6 = (deferredCharNode->super_Node).thisConsumes;
        CVar7 = (deferredCharNode->super_Node).followConsumes;
        (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
        (local_38->super_Node).features = uVar8;
        *(undefined4 *)&(local_38->super_Node).field_0xc = uVar9;
        (local_38->super_Node).firstSet = pCVar3;
        (local_38->super_Node).followSet = pCVar4;
        (local_38->super_Node).prevConsumes = CVar5;
        (local_38->super_Node).thisConsumes = CVar6;
        (local_38->super_Node).followConsumes = CVar7;
        (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
        *(undefined8 *)local_38->cs = *(undefined8 *)deferredCharNode->cs;
        local_38->isEquivClass = deferredCharNode->isEquivClass;
        pEVar15 = this->next;
      }
      if (this->inputLim < pEVar15 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
        pEVar15 = this->next;
      }
      this->next = pEVar15 + 1;
      bVar10 = OptNonGreedy(this);
      lower = 1;
    }
LAB_00ea8e75:
    upper = 0xffffffff;
LAB_00ea9145:
    pNVar16 = NewLoopNode(this,lower,upper,bVar10,&local_38->super_Node);
    return pNVar16;
  }
  if (EVar11 == L'?') {
    if (local_38 == deferredCharNode) {
      local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
      (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_015426a8;
      uVar8 = (deferredCharNode->super_Node).features;
      uVar9 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
      pCVar3 = (deferredCharNode->super_Node).firstSet;
      pCVar4 = (deferredCharNode->super_Node).followSet;
      CVar5 = (deferredCharNode->super_Node).prevConsumes;
      CVar6 = (deferredCharNode->super_Node).thisConsumes;
      CVar7 = (deferredCharNode->super_Node).followConsumes;
      (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
      (local_38->super_Node).features = uVar8;
      *(undefined4 *)&(local_38->super_Node).field_0xc = uVar9;
      (local_38->super_Node).firstSet = pCVar3;
      (local_38->super_Node).followSet = pCVar4;
      (local_38->super_Node).prevConsumes = CVar5;
      (local_38->super_Node).thisConsumes = CVar6;
      (local_38->super_Node).followConsumes = CVar7;
      (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
      *(undefined8 *)local_38->cs = *(undefined8 *)deferredCharNode->cs;
      local_38->isEquivClass = deferredCharNode->isEquivClass;
      pEVar15 = this->next;
    }
    if (this->inputLim < pEVar15 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pEVar15 = this->next;
    }
    this->next = pEVar15 + 1;
    bVar10 = OptNonGreedy(this);
    lower = 0;
    upper = 1;
    goto LAB_00ea9145;
  }
  if (EVar11 != L'{') goto LAB_00ea8d45;
  if (local_38 == deferredCharNode) {
    local_38 = (MatchCharNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
    (local_38->super_Node)._vptr_Node = (_func_int **)&PTR___cxa_pure_virtual_015426a8;
    uVar8 = (deferredCharNode->super_Node).features;
    uVar9 = *(undefined4 *)&(deferredCharNode->super_Node).field_0xc;
    pCVar3 = (deferredCharNode->super_Node).firstSet;
    pCVar4 = (deferredCharNode->super_Node).followSet;
    CVar5 = (deferredCharNode->super_Node).prevConsumes;
    CVar6 = (deferredCharNode->super_Node).thisConsumes;
    CVar7 = (deferredCharNode->super_Node).followConsumes;
    (local_38->super_Node).tag = (deferredCharNode->super_Node).tag;
    (local_38->super_Node).features = uVar8;
    *(undefined4 *)&(local_38->super_Node).field_0xc = uVar9;
    (local_38->super_Node).firstSet = pCVar3;
    (local_38->super_Node).followSet = pCVar4;
    (local_38->super_Node).prevConsumes = CVar5;
    (local_38->super_Node).thisConsumes = CVar6;
    (local_38->super_Node).followConsumes = CVar7;
    (local_38->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
    *(undefined8 *)local_38->cs = *(undefined8 *)deferredCharNode->cs;
    local_38->isEquivClass = deferredCharNode->isEquivClass;
    pEVar15 = this->next;
  }
  if (this->inputLim < pEVar15 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar10) goto LAB_00ea9166;
    *puVar12 = 0;
    pEVar15 = this->next;
  }
  this->next = pEVar15 + 1;
  lower = RepeatCount(this);
  pEVar15 = this->next;
  if (this->inputLim < pEVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                        ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar10) goto LAB_00ea9166;
    *puVar12 = 0;
    pEVar15 = this->next;
  }
  if (*pEVar15 == L'}') {
    if (this->inputLim < pEVar15 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pEVar15 = this->next;
    }
    this->next = pEVar15 + 1;
    bVar10 = OptNonGreedy(this);
    upper = lower;
    goto LAB_00ea9145;
  }
  if (*pEVar15 == L',') {
    pEVar19 = this->inputLim;
    if (pEVar19 < pEVar15 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pEVar19 = this->inputLim;
      pEVar15 = this->next;
    }
    pEVar15 = pEVar15 + 1;
    this->next = pEVar15;
    if (pEVar19 < pEVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ea9166;
      *puVar12 = 0;
      pEVar15 = this->next;
    }
    if (*pEVar15 != L'}') {
      upper = RepeatCount(this);
      if (upper < lower) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x5ce,"(lower <= upper)","lower <= upper");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
      }
      EVar11 = ECLookahead(this,0);
      if (EVar11 != L'}') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x5cf,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
        if (!bVar10) goto LAB_00ea9166;
        *puVar12 = 0;
      }
      ECConsume(this,1);
      bVar10 = OptNonGreedy(this);
      goto LAB_00ea9145;
    }
    ECConsume(this,1);
    bVar10 = OptNonGreedy(this);
    goto LAB_00ea8e75;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar12 = 1;
  uVar20 = 0x5d7;
LAB_00ea903c:
  bVar10 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                      ,uVar20,"(false)","false");
  if (bVar10) {
    *puVar12 = 0;
    return &local_38->super_Node;
  }
LAB_00ea9166:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Node* Parser<P, IsLiteral>::TermPass1(MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        Node* node = 0;
        bool containsSurrogatePair = false;
        switch (ECLookahead())
        {
        case '^':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::BOL); // No quantifier allowed
        case '$':
            ECConsume();
            return Anew(ctAllocator, SimpleNode, Node::EOL); // No quantifier allowed
        case '\\':
            ECConsume();
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; // For quantifier
            }
            else if (AtomEscapePass1(node, deferredCharNode, previousSurrogatePart))
            {
                return node; // No quantifier allowed
            }
            break; // else: fall-through for opt quantifier
        case '(':
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                switch (ECLookahead(1))
                {
                case '=':
                    ECConsume(2); // ?=
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, false, node);
                    break; // As per Annex B, allow this to be quantifiable
                case '!':
                    ECConsume(2); // ?!
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, AssertionNode, true, node);
                    break; // As per Annex B, allow this to be quantifiable
                case ':':
                    ECConsume(2); // ?:
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    break; // fall-through for opt quantifier
                default:
                    {
                        // ? not yet consumed
                        int thisGroupId = nextGroupId++;
                        node = DisjunctionPass1();
                        Assert(ECLookahead() == ')');
                        ECConsume(); // )
                        node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                        break; // fall-through for opt quantifier
                    }
                }
                break;
            default:
                {
                    // next char not yet consumed
                    int thisGroupId = nextGroupId++;
                    node = DisjunctionPass1();
                    Assert(ECLookahead() == ')');
                    ECConsume(); // )
                    node = Anew(ctAllocator, DefineGroupNode, thisGroupId, node);
                    break; // fall-through for opt quantifier
                }
            }
            break;
        case '.':
            {
                ECConsume();
                node = GetNodeWithValidCharacterSet('.');
                break; // fall-through for opt quantifier
            }
        case '[':
            ECConsume();
            if (unicodeFlagPresent)
            {
                containsSurrogatePair = this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->rangeLocation == next;
            }

            node = containsSurrogatePair ? CharacterClassPass1<true>() : CharacterClassPass1<false>();

            Assert(ECLookahead() == ']');
            ECConsume(); // ]
            break; // fall-through for opt quantifier
#if DBG
        case ')':
        case '|':
            Assert(false);
            break;
#endif
        case ']':
            // SPEC DEVIATION: This should be syntax error, instead accept as itself
            deferredCharNode->cs[0] = NextChar();
            node = deferredCharNode;
            break; // fall-through for opt quantifier
#if DBG
        case '*':
        case '+':
        case '?':
            AssertMsg(false, "Allowed only in the escaped form. These should be caught by TermPass0.");
            break;
#endif
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            if(SurrogatePairPass1(node, deferredCharNode, previousSurrogatePart))
            {
                break; //For quantifier
            }
            else
            {
                deferredCharNode->cs[0] = NextChar();
                node = deferredCharNode;
                break; // fall-through for opt quantifier
            }
        }

        Assert(node != 0);

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, CharCountFlag, OptNonGreedy(), node);
            case '+':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(1, CharCountFlag, OptNonGreedy(), node);
            case '?':
                if (node == deferredCharNode)
                    node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                ECConsume();
                return NewLoopNode(0, 1, OptNonGreedy(), node);
            case '{':
                {
                    if (node == deferredCharNode)
                        node = Anew(ctAllocator, MatchCharNode, *deferredCharNode);
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            return NewLoopNode(lower, CharCountFlag, OptNonGreedy(), node);
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            Assert(lower <= upper);
                            Assert(ECLookahead() == '}');
                            ECConsume(); // }
                            return NewLoopNode(lower, upper, OptNonGreedy(), node);
                        }
                    case '}':
                        ECConsume();
                        return NewLoopNode(lower, lower, OptNonGreedy(), node);
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }

        return node;
    }